

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall Am_Object::Remove_Slot(Am_Object *this,Am_Slot_Key key)

{
  am_CList *this_00;
  Am_Slot_Data *slot_00;
  Am_Object_Advanced local_50;
  Am_Slot local_48;
  Am_Slot_Data *local_40;
  Am_Slot_Data *new_slot;
  Am_Slot_Data *slot_proto;
  uint local_24;
  Am_Slot_Data *pAStack_20;
  uint i;
  Am_Slot_Data *slot;
  Am_Object *pAStack_10;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  slot._6_2_ = key;
  pAStack_10 = this;
  if (this->data != (Am_Object_Data *)0x0) {
    Am_Object_Data::find_slot_and_position(this->data,key,&stack0xffffffffffffffe0,&local_24);
    if (pAStack_20 != (Am_Slot_Data *)0x0) {
      this_00 = &pAStack_20->dependencies;
      Am_Slot::Am_Slot((Am_Slot *)&slot_proto,pAStack_20);
      am_CList::Invalidate
                (this_00,(Am_Slot *)&slot_proto,(Am_Constraint *)0x0,&pAStack_20->super_Am_Value);
      DynArray::Delete(&this->data->data,local_24);
      if ((*(ushort *)&pAStack_20->field_0x38 & 0x20) == 0) {
        new_slot = (Am_Slot_Data *)0x0;
        if (this->data->prototype != (Am_Object_Data *)0x0) {
          new_slot = Am_Object_Data::find_slot(this->data->prototype,slot._6_2_);
        }
        if (new_slot == (Am_Slot_Data *)0x0) {
          Am_Object_Data::delete_slot(this->data,pAStack_20,(Am_Slot_Data *)0x0);
        }
        else {
          Am_Object_Data::delete_slot(this->data,pAStack_20,new_slot);
          if ((new_slot->enabled_demons & this->data->prototype->bits_mask) != 0) {
            Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
            Am_Object_Advanced::Am_Object_Advanced(&local_50,this->data);
            local_48 = Am_Object_Advanced::Get_Slot(&local_50,slot._6_2_);
            slot_00 = Am_Slot::operator_cast_to_Am_Slot_Data_(&local_48);
            Am_Object_Advanced::~Am_Object_Advanced(&local_50);
            local_40 = slot_00;
            Am_Object_Data::enqueue_change(this->data,slot_00);
          }
        }
      }
    }
    return this;
  }
  Am_Error("** Remove_Slot called on a (0L) object.");
}

Assistant:

Am_Object &
Am_Object::Remove_Slot(Am_Slot_Key key)
{
  if (!data)
    Am_Error("** Remove_Slot called on a (0L) object.");
  Am_Slot_Data *slot;
  unsigned i;
  data->find_slot_and_position(key, slot, i);
  if (slot) {
    slot->dependencies.Invalidate(slot, nullptr, *slot);
    data->data.Delete(i);
    if (!(slot->flags & BIT_IS_PART)) {
      Am_Slot_Data *slot_proto = nullptr;
      if (data->prototype)
        slot_proto = data->prototype->find_slot(key);
      if (slot_proto) {
        data->delete_slot(slot, slot_proto);
        if (slot_proto->enabled_demons & data->prototype->bits_mask) {
          data->Note_Reference();
          Am_Slot_Data *new_slot =
              (Am_Slot_Data *)Am_Object_Advanced(data).Get_Slot(key);
          data->enqueue_change(new_slot);
        }
      } else
        data->delete_slot(slot, nullptr);
    }
  }
  return *this;
}